

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# illegal_opcodes.c
# Opt level: O3

uint8_t absolute_SLO(cpu_registers *registers)

{
  uint8_t uVar1;
  uint16_t address_to_store_in;
  undefined8 in_RAX;
  uint8_t data;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  uVar1 = fetch_absolute(registers);
  uStack_18._7_1_ = uVar1;
  base_shift_left(registers,(uint8_t *)((long)&uStack_18 + 7));
  address_to_store_in = calc_absolute_address(registers);
  base_store(address_to_store_in,(uint8_t *)((long)&uStack_18 + 7));
  base_or(registers,uStack_18._7_1_);
  return '\0';
}

Assistant:

uint8_t absolute_SLO(cpu_registers* registers) {
    uint8_t data = fetch_absolute(registers);
    base_shift_left(registers, &data);
    base_store(calc_absolute_address(registers), &data);
    base_or(registers, data);
    return ZERO_EXTRA_CYCLES;
}